

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

item_accessor * __thiscall
pybind11::detail::object_api<pybind11::handle>::operator[]
          (item_accessor *__return_storage_ptr__,object_api<pybind11::handle> *this,handle key)

{
  PyObject *pPVar1;
  object local_10;
  
  pPVar1 = *(PyObject **)this;
  if (key.m_ptr != (PyObject *)0x0) {
    (key.m_ptr)->ob_refcnt = (key.m_ptr)->ob_refcnt + 1;
  }
  (__return_storage_ptr__->obj).m_ptr = pPVar1;
  local_10.super_handle.m_ptr = (handle)(PyObject *)0x0;
  (__return_storage_ptr__->key).super_handle.m_ptr = key.m_ptr;
  (__return_storage_ptr__->cache).super_handle.m_ptr = (PyObject *)0x0;
  object::~object(&local_10);
  return __return_storage_ptr__;
}

Assistant:

item_accessor object_api<D>::operator[](handle key) const {
    return {derived(), reinterpret_borrow<object>(key)};
}